

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O0

void __thiscall mesh<double>::mesh(mesh<double> *this,string *file,shared_ptr<material<double>_> *m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  char *pcVar6;
  vec3<double> *__args_2;
  string *in_RSI;
  hit<double> *in_RDI;
  int v2;
  int v1;
  int v0;
  point3<double> temp_vert;
  double maxz;
  double maxy;
  double maxx;
  double minz;
  double miny;
  double minx;
  int i;
  int count;
  double z;
  double y;
  double x;
  vec3<double> temp_pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  stringstream lstream;
  string op;
  string line;
  ifstream file_;
  value_type *in_stack_fffffffffffffa18;
  string *in_stack_fffffffffffffa20;
  reference in_stack_fffffffffffffa28;
  reference in_stack_fffffffffffffa30;
  vec3<double> *in_stack_fffffffffffffa38;
  reference in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  vec3<double> *in_stack_fffffffffffffa60;
  vec3<double> *in_stack_fffffffffffffa68;
  vec3<double> local_530;
  vec3<double> local_518;
  undefined4 local_4fc;
  string local_4e8;
  undefined8 local_4c8;
  vec3<double> local_4a8 [2];
  vec3<double> *local_478;
  double local_470;
  double local_468;
  vec3<double> *local_460;
  double local_458;
  double local_450;
  undefined4 local_448;
  undefined4 local_444;
  vec3<double> *local_440;
  double local_438;
  double local_430;
  char in_stack_fffffffffffffc07;
  string *in_stack_fffffffffffffc08;
  ostream local_3e8 [376];
  string local_270 [32];
  string local_250 [32];
  istream local_230 [544];
  string *local_10;
  
  local_10 = in_RSI;
  hit<double>::hit(in_RDI);
  in_RDI->_vptr_hit = (_func_int **)&PTR_is_hit_00124ce0;
  std::shared_ptr<material<double>_>::shared_ptr
            ((shared_ptr<material<double>_> *)in_stack_fffffffffffffa20,
             (shared_ptr<material<double>_> *)in_stack_fffffffffffffa18);
  std::ifstream::ifstream(in_RDI + 3);
  vec3<double>::vec3((vec3<double> *)in_stack_fffffffffffffa20);
  vec3<double>::vec3((vec3<double> *)in_stack_fffffffffffffa20);
  hit_list<double>::hit_list((hit_list<double> *)in_stack_fffffffffffffa20);
  std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::vector
            ((vector<vec3<double>,_std::allocator<vec3<double>_>_> *)0x1153d8);
  std::ifstream::ifstream(local_230,local_10,_S_in);
  std::__cxx11::string::string(local_250);
  std::__cxx11::string::string(local_270);
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffc08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11542a);
  vec3<double>::vec3((vec3<double> *)in_stack_fffffffffffffa20);
  local_444 = 0;
  local_448 = 0;
  local_450 = 10.0;
  local_458 = 10.0;
  local_460 = (vec3<double> *)0x4024000000000000;
  local_468 = 0.0;
  local_470 = 0.0;
  local_478 = (vec3<double> *)0x0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_230,local_250);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar1) break;
    std::operator<<(local_3e8,local_250);
    std::operator>>((istream *)&stack0xfffffffffffffc08,local_270);
    split<double>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc07);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa30,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa30);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_250);
    if (*pcVar6 == 'v') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffbf0,1);
      local_430 = std::__cxx11::stod(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffbf0,2);
      local_438 = std::__cxx11::stod(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffbf0,3);
      in_stack_fffffffffffffa68 =
           (vec3<double> *)
           std::__cxx11::stod(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18);
      if (local_450 < local_430) {
        local_468 = local_430;
      }
      if (local_458 < local_438) {
        local_470 = local_438;
      }
      if ((double)local_460 < (double)in_stack_fffffffffffffa68) {
        local_478 = in_stack_fffffffffffffa68;
      }
      if (local_430 < local_450) {
        local_450 = local_430;
      }
      if (local_438 < local_458) {
        local_458 = local_438;
      }
      if ((double)in_stack_fffffffffffffa68 < (double)local_460) {
        local_460 = in_stack_fffffffffffffa68;
      }
      local_440 = in_stack_fffffffffffffa68;
      vec3<double>::vec3(local_4a8,local_430,local_438,(double)in_stack_fffffffffffffa68);
      in_stack_fffffffffffffa60 = (vec3<double> *)(in_RDI + 0x4e);
      local_4c8 = 0x3ff0000000000000;
      operator*(in_stack_fffffffffffffa40->e,in_stack_fffffffffffffa38);
      std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::push_back
                ((vector<vec3<double>,_std::allocator<vec3<double>_>_> *)in_stack_fffffffffffffa20,
                 in_stack_fffffffffffffa18);
    }
    else {
      __args_2 = (vec3<double> *)std::__cxx11::string::operator[]((ulong)local_250);
      if (*(char *)__args_2->e == 'f') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffbf0,1);
        iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18,0);
        local_4e8.field_2._12_4_ = iVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffbf0,2);
        iVar3 = std::__cxx11::stoi(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18,0);
        local_4e8.field_2._8_4_ = iVar3;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffbf0,3);
        iVar4 = std::__cxx11::stoi(in_stack_fffffffffffffa20,(size_t *)in_stack_fffffffffffffa18,0);
        in_stack_fffffffffffffa38 = (vec3<double> *)(in_RDI + 0x4a);
        local_4e8.field_2._M_allocated_capacity._4_4_ = iVar4;
        in_stack_fffffffffffffa40 =
             std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                       ((vector<vec3<double>,_std::allocator<vec3<double>_>_> *)
                        in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
        in_stack_fffffffffffffa30 =
             std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                       ((vector<vec3<double>,_std::allocator<vec3<double>_>_> *)
                        in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
        in_stack_fffffffffffffa28 =
             std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                       ((vector<vec3<double>,_std::allocator<vec3<double>_>_> *)
                        in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
        local_4fc = 0;
        std::
        make_shared<triangle<double>,vec3<double>&,vec3<double>&,vec3<double>&,int,std::shared_ptr<material<double>>&>
                  (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,__args_2,
                   (int *)CONCAT44(iVar2,iVar3),
                   (shared_ptr<material<double>_> *)CONCAT44(iVar4,in_stack_fffffffffffffa48));
        in_stack_fffffffffffffa20 = &local_4e8;
        std::shared_ptr<hit<double>>::shared_ptr<triangle<double>,void>
                  ((shared_ptr<hit<double>_> *)in_stack_fffffffffffffa20,
                   (shared_ptr<triangle<double>_> *)in_stack_fffffffffffffa18);
        hit_list<double>::add
                  ((hit_list<double> *)in_stack_fffffffffffffa20,
                   (shared_ptr<hit<double>_> *)in_stack_fffffffffffffa18);
        std::shared_ptr<hit<double>_>::~shared_ptr((shared_ptr<hit<double>_> *)0x1159d8);
        std::shared_ptr<triangle<double>_>::~shared_ptr((shared_ptr<triangle<double>_> *)0x1159e5);
      }
    }
  }
  vec3<double>::vec3(&local_518,local_450,local_458,(double)local_460);
  in_RDI[0x46]._vptr_hit = (_func_int **)local_518.e[2];
  in_RDI[0x44]._vptr_hit = (_func_int **)local_518.e[0];
  in_RDI[0x45]._vptr_hit = (_func_int **)local_518.e[1];
  vec3<double>::vec3(&local_530,local_468,local_470,(double)local_478);
  in_RDI[0x47]._vptr_hit = (_func_int **)local_530.e[0];
  in_RDI[0x48]._vptr_hit = (_func_int **)local_530.e[1];
  in_RDI[0x49]._vptr_hit = (_func_int **)local_530.e[2];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa30);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffc08);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

mesh<T>::mesh(const std::string& file, std::shared_ptr<material<T>> m) : m_(m) {
  std::ifstream file_(file);
  std::string line, op;
  std::stringstream lstream;
  std::vector<std::string> ss;

  vec3<T> temp_pos;
  T x, y, z;
  int count{0};
  int i = 0;
  T minx(10), miny(10), minz(10);
  T maxx(0), maxy(0), maxz(0);
  while (std::getline(file_, line)) {
    lstream << line;
    lstream >> op;
    ss = split<T>(line, ' ');
    // std::cerr << ss[0] << "\n";
    if (line[0] == 'v') {
      // std::cerr << "PRINT \n";
      // lstream >> x >> y >> z;
      x = std::stod(ss[1]);
      y = std::stod(ss[2]);
      z = std::stod(ss[3]);
      if (x > minx)
        maxx = x;
      if (y > miny)
        maxy = y;
      if (z > minz)
        maxz = z;
      if (x < minx)
        minx = x;
      if (y < miny)
        miny = y;
      if (z < minz)
        minz = z;

      point3<T> temp_vert(x, y, z);
      verts.push_back(1.0 * temp_vert);
    } else if (line[0] == 'f') {
      int v0, v1, v2;
      v0 = std::stoi(ss[1]);
      v1 = std::stoi(ss[2]);
      v2 = std::stoi(ss[3]);
      // lstream >> v0 >> v1 >> v2;
      faces.add(std::make_shared<triangle<T>>(
          verts.at(v0 - 1), verts.at(v1 - 1), verts.at(v2 - 1), 0, m));
    }
  }
  min_ = point3<T>(minx, miny, minz);
  max_ = point3<T>(maxx, maxy, maxz);
}